

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

AdaptorPair *
cfd::core::AdaptorUtil::Sign
          (AdaptorPair *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,Pubkey *adaptor)

{
  pointer ctx_00;
  int iVar1;
  uchar *adaptor_sig65;
  uchar *adaptor_proof97;
  uchar *seckey32;
  uchar *msg32;
  CfdException *this;
  ByteData local_1a8;
  undefined1 local_190 [8];
  AdaptorProof adaptor_proof;
  undefined1 local_160 [8];
  AdaptorSignature adaptor_sig;
  string local_140;
  ByteData local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  ByteData local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  int local_c0;
  undefined1 local_b9;
  int ret;
  secp256k1_pubkey adaptor_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_proof_raw;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_sig_raw;
  secp256k1_context_struct *ctx;
  Pubkey *adaptor_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator(&local_49);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x41,&local_49);
  ::std::allocator<unsigned_char>::~allocator(&local_49);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(adaptor_key.data + 0x38));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(adaptor_key.data + 0x39),0x61
             ,(allocator<unsigned_char> *)(adaptor_key.data + 0x38));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(adaptor_key.data + 0x38))
  ;
  ParsePubkey((secp256k1_pubkey *)&local_b9,adaptor);
  ctx_00 = adaptor_sig_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  adaptor_sig65 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  adaptor_proof97 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(adaptor_key.data + 0x39)
                 );
  Privkey::GetData(&local_f0,sk);
  ByteData::GetBytes(&local_d8,&local_f0);
  seckey32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  ByteData256::GetData(&local_120,msg);
  ByteData::GetBytes(&local_108,&local_120);
  msg32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
  iVar1 = secp256k1_ecdsa_adaptor_sign
                    ((secp256k1_context *)ctx_00,adaptor_sig65,adaptor_proof97,seckey32,
                     (secp256k1_pubkey *)&local_b9,msg32);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
  ByteData::~ByteData(&local_120);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  ByteData::~ByteData(&local_f0);
  local_c0 = iVar1;
  if (iVar1 != 1) {
    adaptor_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_140,"Could not create adaptor signature.",
               (allocator *)
               ((long)&adaptor_sig.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(this,kCfdInternalError,&local_140);
    adaptor_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData((ByteData *)
                     &adaptor_proof.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  AdaptorSignature::AdaptorSignature
            ((AdaptorSignature *)local_160,
             (ByteData *)
             &adaptor_proof.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &adaptor_proof.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  ByteData::ByteData(&local_1a8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (adaptor_key.data + 0x39));
  AdaptorProof::AdaptorProof((AdaptorProof *)local_190,&local_1a8);
  ByteData::~ByteData(&local_1a8);
  AdaptorSignature::AdaptorSignature
            (&__return_storage_ptr__->signature,(AdaptorSignature *)local_160);
  AdaptorProof::AdaptorProof(&__return_storage_ptr__->proof,(AdaptorProof *)local_190);
  AdaptorProof::~AdaptorProof((AdaptorProof *)local_190);
  AdaptorSignature::~AdaptorSignature((AdaptorSignature *)local_160);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(adaptor_key.data + 0x39));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

AdaptorPair AdaptorUtil::Sign(
    const ByteData256 &msg, const Privkey &sk, const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> adaptor_sig_raw(
      AdaptorSignature::kAdaptorSignatureSize);
  std::vector<uint8_t> adaptor_proof_raw(AdaptorProof::kAdaptorProofSize);
  auto adaptor_key = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_sign(
      ctx, adaptor_sig_raw.data(), adaptor_proof_raw.data(),
      sk.GetData().GetBytes().data(), &adaptor_key,
      msg.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create adaptor signature.");
  }
  AdaptorSignature adaptor_sig(adaptor_sig_raw);
  AdaptorProof adaptor_proof(adaptor_proof_raw);

  return AdaptorPair{adaptor_sig, adaptor_proof};
}